

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lev_main.c
# Opt level: O3

boolean write_level_file(char *filename,sp_lev *lvl)

{
  long *__buf;
  ulong *puVar1;
  char cVar2;
  byte bVar3;
  opvar *poVar4;
  byte *__ptr;
  int iVar5;
  uint uVar6;
  size_t sVar7;
  size_t sVar8;
  ssize_t sVar9;
  ulong uVar10;
  char *__format;
  char *pcVar11;
  int iVar12;
  void *opdat;
  long lVar13;
  long lVar14;
  char lbuf [60];
  _opcode tmpo;
  long in_stack_fffffffffffffec8;
  int local_104;
  char *local_100;
  char local_f8 [4];
  undefined1 auStack_f4 [4];
  undefined1 auStack_f0 [56];
  ulong local_b8;
  byte *pbStack_b0;
  
  if (decompile == 0) {
LAB_0010dc46:
    local_f8[0] = '\0';
    strcat(local_f8,outprefix);
    strcat(local_f8,filename);
    sVar7 = strlen(local_f8);
    auStack_f4[sVar7] = 0;
    builtin_strncpy(local_f8 + sVar7,".lev",4);
    iVar5 = open(local_f8,0x41,0x1a4);
    if (-1 < iVar5) {
      if (lvl == (sp_lev *)0x0) {
        panic("write_level_file");
      }
      if (be_verbose != 0) {
        fprintf(_stdout,"File: \'%s\', opcodes: %li\n",local_f8,lvl->n_opcodes);
      }
      sVar9 = write(iVar5,write_common_data_version_data,0xc);
      if (sVar9 == 0xc) {
        __buf = &lvl->n_opcodes;
        sVar9 = write(iVar5,__buf,8);
        if (sVar9 == 8) {
          if (0 < *__buf) {
            lVar14 = 0;
            lVar13 = 0;
            do {
              puVar1 = (ulong *)((long)&lvl->opcodes->opcode + lVar14);
              local_b8 = *puVar1;
              pbStack_b0 = (byte *)puVar1[1];
              sVar9 = write(iVar5,&local_b8,4);
              __ptr = pbStack_b0;
              if (sVar9 != 4) {
                return '\0';
              }
              if (0x4b < (uint)local_b8) {
                panic("write_maze: unknown opcode (%i).",local_b8 & 0xffffffff);
              }
              if ((uint)local_b8 == 0x28) {
                if (pbStack_b0 == (byte *)0x0) {
                  panic("write_maze: PUSH with no data.");
                }
                sVar9 = write(iVar5,pbStack_b0,1);
                if (sVar9 != 1) {
                  return '\0';
                }
                bVar3 = *__ptr;
                if (8 < bVar3) {
                  pcVar11 = "write_maze: unknown data type (%i).";
                  uVar6 = (int)(char)bVar3;
LAB_0010ddf4:
                  panic(pcVar11,(ulong)uVar6);
                }
                if ((0x1f2U >> (bVar3 & 0x1f) & 1) == 0) {
                  if ((0xcU >> (bVar3 & 0x1f) & 1) != 0) {
                    if (*(char **)(__ptr + 8) == (char *)0x0) {
                      iVar12 = 0;
                    }
                    else {
                      sVar7 = strlen(*(char **)(__ptr + 8));
                      iVar12 = (int)sVar7;
                    }
                    local_104 = iVar12;
                    sVar9 = write(iVar5,&local_104,4);
                    if (sVar9 != 4) {
                      return '\0';
                    }
                    if (iVar12 != 0) {
                      sVar7 = write(iVar5,*(void **)(__ptr + 8),(long)iVar12);
                      if (sVar7 != (long)iVar12) {
                        return '\0';
                      }
                      if (*(void **)(__ptr + 8) != (void *)0x0) {
                        free(*(void **)(__ptr + 8));
                      }
                    }
                  }
                }
                else {
                  sVar9 = write(iVar5,__ptr + 8,8);
                  if (sVar9 != 8) {
                    return '\0';
                  }
                }
                free(__ptr);
              }
              else if (pbStack_b0 != (byte *)0x0) {
                pcVar11 = "write_maze: opcode (%i) has data.";
                uVar6 = (uint)local_b8;
                goto LAB_0010ddf4;
              }
              lVar13 = lVar13 + 1;
              lVar14 = lVar14 + 0x10;
            } while (lVar13 < *__buf);
          }
          if (lvl->opcodes != (_opcode *)0x0) {
            free(lvl->opcodes);
          }
          lvl->opcodes = (_opcode *)0x0;
          close(iVar5);
          return '\x01';
        }
      }
    }
    return '\0';
  }
  local_f8[0] = '\0';
  strcat(local_f8,outprefix);
  strcat(local_f8,filename);
  sVar7 = strlen(local_f8);
  builtin_strncpy(local_f8 + sVar7,"_lev.txt",8);
  auStack_f0[sVar7] = 0;
  iVar5 = open(local_f8,0x241,0x1a4);
  if (iVar5 < 0) {
    return '\0';
  }
  local_100 = filename;
  if (lvl->n_opcodes < 1) {
LAB_0010dc38:
    close(iVar5);
    filename = local_100;
    goto LAB_0010dc46;
  }
  lVar13 = 0;
LAB_0010d8b0:
  uVar6 = lvl->opcodes[lVar13].opcode;
  poVar4 = lvl->opcodes[lVar13].opdat;
  if (0x4b < (ulong)(long)(int)uVar6) {
    panic("decompile_maze: unknown opcode (%i).",(ulong)uVar6);
  }
  if (uVar6 != 0x28) {
    if (poVar4 != (opvar *)0x0) {
      panic("decompile_maze: opcode (%i) has data.",(ulong)uVar6);
    }
    snprintf((char *)&local_b8,0x7f,"%li:\t%s\n",lVar13,
             &DAT_00116134 + *(int *)(&DAT_00116134 + (long)(int)uVar6 * 4));
    goto LAB_0010d9d7;
  }
  if (poVar4 == (opvar *)0x0) {
    panic("decompile_maze: PUSH with no data.");
  }
  cVar2 = poVar4->spovartyp;
  uVar6 = (uint)((ulong)in_stack_fffffffffffffec8 >> 0x20);
  switch(cVar2) {
  case '\0':
    goto switchD_0010d90f_caseD_0;
  case '\x01':
    pcVar11 = (poVar4->vardata).str;
    if (pcVar11 + -0x20 < (char *)0x5f) {
      in_stack_fffffffffffffec8 = (ulong)uVar6 << 0x20;
      __format = "%li:\t%s\tint:%li\t# \'%c\'\n";
    }
    else {
      __format = "%li:\t%s\tint:%li\n";
    }
    break;
  case '\x02':
  case '\x03':
    pcVar11 = (poVar4->vardata).str;
    if (pcVar11 == (char *)0x0) goto switchD_0010d90f_caseD_0;
    sVar7 = strlen(pcVar11);
    uVar6 = (uint)sVar7;
    if (uVar6 != 0) {
      if ((int)uVar6 < 0x80) {
        if (0 < (int)uVar6) {
          uVar10 = 0;
          do {
            if ((byte)(pcVar11[uVar10] + 0x81U) < 0xa1) goto LAB_0010db51;
            uVar10 = uVar10 + 1;
          } while ((uVar6 & 0x7fffffff) != uVar10);
        }
        __format = "%li:\t%s\tstr:\"%s\"\n";
        if (cVar2 == '\x03') {
          __format = "%li:\t%s\tvar:$%s\n";
        }
        break;
      }
LAB_0010db51:
      snprintf((char *)&local_b8,0x7f,"%li:\t%s\tstr:",lVar13,"push");
      sVar7 = strlen((char *)&local_b8);
      sVar7 = write(iVar5,&local_b8,sVar7);
      sVar8 = strlen((char *)&local_b8);
      if (sVar7 == sVar8) {
        if (0 < (int)uVar6) {
          uVar10 = 0;
          do {
            snprintf((char *)&local_b8,0x7f,"%02x ",(ulong)(uint)(int)(poVar4->vardata).str[uVar10])
            ;
            sVar7 = strlen((char *)&local_b8);
            sVar7 = write(iVar5,&local_b8,sVar7);
            sVar8 = strlen((char *)&local_b8);
            if (sVar7 != sVar8) goto LAB_0010dc38;
            uVar10 = uVar10 + 1;
          } while ((uVar6 & 0x7fffffff) != uVar10);
        }
        local_b8 = CONCAT62(local_b8._2_6_,10);
        goto LAB_0010d9d7;
      }
      goto LAB_0010dc38;
    }
    goto switchD_0010d90f_caseD_0;
  case '\x04':
    pcVar11 = (char *)((poVar4->vardata).l & 0xff);
    in_stack_fffffffffffffec8 = 0;
    __format = "%li:\t%s\tcoord:(%li,%li)\n";
    break;
  case '\x05':
    pcVar11 = (char *)((poVar4->vardata).l & 0xff);
    in_stack_fffffffffffffec8 = 0;
    __format = "%li:\t%s\tregion:(%li,%li,%li,%li)\n";
    break;
  case '\x06':
    in_stack_fffffffffffffec8 = CONCAT44(uVar6,(int)(char)(*(uint *)&poVar4->vardata >> 8));
    snprintf((char *)&local_b8,0x7f,"%li:\t%s\tmapchar:(%i,%i)\n",lVar13,"push",
             (ulong)(*(uint *)&poVar4->vardata & 0xff),in_stack_fffffffffffffec8);
    goto LAB_0010d9d7;
  case '\a':
    pcVar11 = (char *)(ulong)(*(uint *)&poVar4->vardata >> 8 & 0xffff);
    in_stack_fffffffffffffec8 = (ulong)uVar6 << 0x20;
    __format = "%li:\t%s\tmonst:(pm=%li,class=\'%c\')\n";
    break;
  case '\b':
    pcVar11 = (char *)(ulong)(*(uint *)&poVar4->vardata >> 8 & 0xffff);
    in_stack_fffffffffffffec8 = (ulong)uVar6 << 0x20;
    __format = "%li:\t%s\tobj:(id=%li,class=\'%c\')\n";
    break;
  default:
    panic("decompile_maze: unknown data type (%i).",(ulong)(uint)(int)cVar2);
  }
  snprintf((char *)&local_b8,0x7f,__format,lVar13,"push",pcVar11);
LAB_0010d9d7:
  sVar7 = strlen((char *)&local_b8);
  sVar7 = write(iVar5,&local_b8,sVar7);
  sVar8 = strlen((char *)&local_b8);
  if (sVar7 != sVar8) goto LAB_0010dc38;
switchD_0010d90f_caseD_0:
  lVar13 = lVar13 + 1;
  if (lvl->n_opcodes <= lVar13) goto LAB_0010dc38;
  goto LAB_0010d8b0;
}

Assistant:

boolean write_level_file(char *filename, sp_lev *lvl)
{
	int fout;
	char lbuf[60];

	if (decompile) {
	    lbuf[0] = '\0';
	    strcat(lbuf, outprefix);
	    strcat(lbuf, filename);
	    strcat(lbuf, "_lev.txt");
	    fout = open(lbuf, O_TRUNC|O_WRONLY|O_CREAT, OMASK);
	    if (fout < 0) return FALSE;
	    decompile_maze(fout, lvl);
	    close(fout);
	}

	lbuf[0] = '\0';
	strcat(lbuf, outprefix);
	strcat(lbuf, filename);
	strcat(lbuf, LEV_EXT);

	fout = open(lbuf, O_WRONLY|O_CREAT|O_BINARY, OMASK);
	if (fout < 0) return FALSE;

	if (!lvl) panic("write_level_file");

	if (be_verbose)
	    fprintf(stdout, "File: '%s', opcodes: %li\n", lbuf, lvl->n_opcodes);

	if (!write_maze(fout, lvl))
	    return FALSE;

	close(fout);

	return TRUE;
}